

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

void __thiscall
FCompileContext::CheckReturn(FCompileContext *this,PPrototype *proto,FScriptPosition *pos)

{
  PType *pPVar1;
  uint uVar2;
  uint uVar3;
  PType **ppPVar4;
  bool bVar5;
  uint local_28;
  uint i;
  bool fail;
  FScriptPosition *pos_local;
  PPrototype *proto_local;
  FCompileContext *this_local;
  
  pos_local = (FScriptPosition *)proto;
  proto_local = (PPrototype *)this;
  if (proto == (PPrototype *)0x0) {
    __assert_fail("proto != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x7b,"void FCompileContext::CheckReturn(PPrototype *, FScriptPosition &)");
  }
  bVar5 = false;
  if (this->ReturnProto == (PPrototype *)0x0) {
    this->ReturnProto = proto;
  }
  else {
    uVar2 = TArray<PType_*,_PType_*>::Size(&this->ReturnProto->ReturnTypes);
    uVar3 = TArray<PType_*,_PType_*>::Size((TArray<PType_*,_PType_*> *)(pos_local + 9));
    if (uVar2 < uVar3) {
      swapvalues<PPrototype*>((PPrototype **)&pos_local,&this->ReturnProto);
    }
    uVar2 = TArray<PType_*,_PType_*>::Size((TArray<PType_*,_PType_*> *)(pos_local + 9));
    if (uVar2 == 0) {
      uVar2 = TArray<PType_*,_PType_*>::Size(&this->ReturnProto->ReturnTypes);
      bVar5 = uVar2 != 0;
    }
    else {
      for (local_28 = 0;
          uVar2 = TArray<PType_*,_PType_*>::Size((TArray<PType_*,_PType_*> *)(pos_local + 9)),
          local_28 < uVar2; local_28 = local_28 + 1) {
        ppPVar4 = TArray<PType_*,_PType_*>::operator[]
                            (&this->ReturnProto->ReturnTypes,(ulong)local_28);
        pPVar1 = *ppPVar4;
        ppPVar4 = TArray<PType_*,_PType_*>::operator[]
                            ((TArray<PType_*,_PType_*> *)(pos_local + 9),(ulong)local_28);
        if (pPVar1 != *ppPVar4) {
          bVar5 = true;
          break;
        }
      }
    }
    if (bVar5) {
      FScriptPosition::Message(pos,2,"All return expressions must deduce to the same type");
    }
  }
  return;
}

Assistant:

void FCompileContext::CheckReturn(PPrototype *proto, FScriptPosition &pos)
{
	assert(proto != nullptr);
	bool fail = false;

	if (ReturnProto == nullptr)
	{
		ReturnProto = proto;
		return;
	}

	// A prototype that defines fewer return types can be compatible with
	// one that defines more if the shorter one matches the initial types
	// for the longer one.
	if (ReturnProto->ReturnTypes.Size() < proto->ReturnTypes.Size())
	{ // Make proto the shorter one to avoid code duplication below.
		swapvalues(proto, ReturnProto);
	}
	// If one prototype returns nothing, they both must.
	if (proto->ReturnTypes.Size() == 0)
	{
		if (ReturnProto->ReturnTypes.Size() != 0)
		{
			fail = true;
		}
	}
	else
	{
		for (unsigned i = 0; i < proto->ReturnTypes.Size(); i++)
		{
			if (ReturnProto->ReturnTypes[i] != proto->ReturnTypes[i])
			{ // Incompatible
				fail = true;
				break;
			}
		}
	}

	if (fail)
	{
		pos.Message(MSG_ERROR, "All return expressions must deduce to the same type");
	}
}